

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.cpp
# Opt level: O2

int str_format(lua_State *L)

{
  byte *__src;
  char cVar1;
  int iVar2;
  byte *pbVar3;
  void *pvVar4;
  ulong uVar5;
  long lVar6;
  size_t l_00;
  char *pcVar7;
  char *pcVar8;
  byte *pbVar9;
  ulong uVar10;
  ulong uVar11;
  byte *pbVar12;
  byte bVar13;
  bool bVar14;
  lua_Number lVar15;
  size_t sStack_22a0;
  int local_228c;
  char form [18];
  size_t l;
  lua_State *local_2260;
  size_t sfl;
  luaL_Buffer b;
  char buff [512];
  
  local_228c = 1;
  pbVar3 = (byte *)luaL_checklstring(L,1,&sfl);
  pbVar9 = pbVar3 + sfl;
  luaL_buffinit(L,&b);
LAB_00111e72:
  while( true ) {
    while( true ) {
      if (pbVar9 <= pbVar3) {
        luaL_pushresult(&b);
        return 1;
      }
      bVar13 = *pbVar3;
      if (bVar13 == 0x25) break;
      if (buff <= b.p) {
        luaL_prepbuffer(&b);
        bVar13 = *pbVar3;
      }
      pbVar3 = pbVar3 + 1;
      *b.p = bVar13;
      b.p = (char *)((byte *)b.p + 1);
    }
    __src = pbVar3 + 1;
    bVar13 = pbVar3[1];
    if (bVar13 != 0x25) break;
    bVar13 = 0x25;
    if (buff <= b.p) {
      luaL_prepbuffer(&b);
      bVar13 = *__src;
    }
    pbVar3 = pbVar3 + 2;
    *b.p = bVar13;
    b.p = (char *)((byte *)b.p + 1);
  }
  local_228c = local_228c + 1;
  uVar11 = 0;
  local_2260 = L;
  while ((bVar13 != 0 && (pvVar4 = memchr("-+ #0",(int)(char)bVar13,6), pvVar4 != (void *)0x0))) {
    bVar13 = pbVar3[uVar11 + 2];
    uVar11 = uVar11 + 1;
  }
  if (5 < uVar11) {
    luaL_error(local_2260,"invalid format (repeated flags)");
    bVar13 = pbVar3[uVar11 + 1];
  }
  L = local_2260;
  uVar5 = (ulong)(bVar13 - 0x30 < 10);
  uVar10 = (ulong)(pbVar3[uVar11 + 1 + uVar5] - 0x30 < 10);
  lVar6 = uVar10 + uVar5;
  bVar13 = pbVar3[uVar11 + 1 + lVar6];
  if (bVar13 == 0x2e) {
    lVar6 = uVar5 + uVar10;
    pbVar12 = pbVar3 + uVar11 + 3 + lVar6;
    if (9 < pbVar3[uVar11 + lVar6 + 2] - 0x30) {
      pbVar12 = pbVar3 + uVar11 + lVar6 + 2;
    }
    pbVar12 = pbVar12 + (*pbVar12 - 0x30 < 10);
    bVar13 = *pbVar12;
  }
  else {
    pbVar12 = pbVar3 + uVar11 + lVar6 + 1;
  }
  if (bVar13 - 0x30 < 10) {
    luaL_error(local_2260,"invalid format (width or precision too long)");
  }
  form[0] = '%';
  strncpy(form + 1,(char *)__src,(size_t)(pbVar12 + (1 - (long)__src)));
  pbVar12[(long)(form + (2 - (long)__src))] = 0;
  bVar13 = *pbVar12;
  pbVar3 = pbVar12 + 1;
  switch(bVar13) {
  case 99:
    lVar15 = luaL_checknumber(L,local_228c);
    sprintf(buff,form,(ulong)(uint)(int)lVar15);
    goto LAB_001120be;
  case 100:
  case 0x69:
    addintlen(form);
    lVar15 = luaL_checknumber(L,local_228c);
    pcVar8 = (char *)(long)lVar15;
    break;
  case 0x65:
  case 0x66:
  case 0x67:
    goto switchD_00112024_caseD_65;
  case 0x68:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x6e:
  case 0x70:
  case 0x72:
  case 0x74:
  case 0x76:
  case 0x77:
switchD_00112024_caseD_68:
    iVar2 = luaL_error(L,"invalid option \'%%%c\' to \'format\'",(ulong)(uint)(int)(char)bVar13);
    return iVar2;
  case 0x6f:
  case 0x75:
  case 0x78:
switchD_00112024_caseD_6f:
    addintlen(form);
    lVar15 = luaL_checknumber(L,local_228c);
    pcVar8 = (char *)((long)(lVar15 - 9.223372036854776e+18) & (long)lVar15 >> 0x3f | (long)lVar15);
    break;
  case 0x71:
    pcVar8 = luaL_checklstring(L,local_228c,&l);
    if (buff <= b.p) {
      luaL_prepbuffer(&b);
    }
    *b.p = '\"';
    b.p = b.p + 1;
    while (bVar14 = l != 0, l = l - 1, bVar14) {
      cVar1 = *pcVar8;
      if (cVar1 == '\0') {
        pcVar7 = "\\000";
        sStack_22a0 = 4;
LAB_001121f5:
        luaL_addlstring(&b,pcVar7,sStack_22a0);
      }
      else if (cVar1 == '\n') {
LAB_00112148:
        pcVar7 = b.p;
        if (buff <= b.p) {
          luaL_prepbuffer(&b);
          pcVar7 = b.p;
        }
        b.p = pcVar7 + 1;
        *pcVar7 = '\\';
        if (buff <= b.p) {
          luaL_prepbuffer(&b);
        }
        *b.p = *pcVar8;
        b.p = b.p + 1;
      }
      else {
        if (cVar1 == '\r') {
          pcVar7 = "\\r";
          sStack_22a0 = 2;
          goto LAB_001121f5;
        }
        if ((cVar1 == '\\') || (cVar1 == '\"')) goto LAB_00112148;
        if (buff <= b.p) {
          luaL_prepbuffer(&b);
          cVar1 = *pcVar8;
        }
        *b.p = cVar1;
        b.p = b.p + 1;
      }
      pcVar8 = pcVar8 + 1;
    }
    if (buff <= b.p) {
      luaL_prepbuffer(&b);
    }
    *b.p = '\"';
    b.p = b.p + 1;
    goto LAB_00111e72;
  case 0x73:
    pcVar8 = luaL_checklstring(L,local_228c,&l);
    pcVar7 = strchr(form,0x2e);
    if ((pcVar7 != (char *)0x0) || (l < 100)) break;
    lua_pushvalue(L,local_228c);
    luaL_addvalue(&b);
    goto LAB_00111e72;
  default:
    if ((bVar13 != 0x45) && (bVar13 != 0x47)) {
      if (bVar13 != 0x58) goto switchD_00112024_caseD_68;
      goto switchD_00112024_caseD_6f;
    }
    goto switchD_00112024_caseD_65;
  }
  sprintf(buff,form,pcVar8);
LAB_001120be:
  l_00 = strlen(buff);
  luaL_addlstring(&b,buff,l_00);
  goto LAB_00111e72;
switchD_00112024_caseD_65:
  luaL_checknumber(L,local_228c);
  sprintf(buff,form);
  goto LAB_001120be;
}

Assistant:

static int str_format (lua_State *L) {
  int arg = 1;
  size_t sfl;
  const char *strfrmt = luaL_checklstring(L, arg, &sfl);
  const char *strfrmt_end = strfrmt+sfl;
  luaL_Buffer b;
  luaL_buffinit(L, &b);
  while (strfrmt < strfrmt_end) {
    if (*strfrmt != L_ESC)
      luaL_addchar(&b, *strfrmt++);
    else if (*++strfrmt == L_ESC)
      luaL_addchar(&b, *strfrmt++);  /* %% */
    else { /* format item */
      char form[MAX_FORMAT];  /* to store the format (`%...') */
      char buff[MAX_ITEM];  /* to store the formatted item */
      arg++;
      strfrmt = scanformat(L, strfrmt, form);
      switch (*strfrmt++) {
        case 'c': {
          sprintf(buff, form, (int)luaL_checknumber(L, arg));
          break;
        }
        case 'd':  case 'i': {
          addintlen(form);
          sprintf(buff, form, (LUA_INTFRM_T)luaL_checknumber(L, arg));
          break;
        }
        case 'o':  case 'u':  case 'x':  case 'X': {
          addintlen(form);
          sprintf(buff, form, (unsigned LUA_INTFRM_T)luaL_checknumber(L, arg));
          break;
        }
        case 'e':  case 'E': case 'f':
        case 'g': case 'G': {
          sprintf(buff, form, (double)luaL_checknumber(L, arg));
          break;
        }
        case 'q': {
          addquoted(L, &b, arg);
          continue;  /* skip the 'addsize' at the end */
        }
        case 's': {
          size_t l;
          const char *s = luaL_checklstring(L, arg, &l);
          if (!strchr(form, '.') && l >= 100) {
            /* no precision and string is too long to be formatted;
               keep original string */
            lua_pushvalue(L, arg);
            luaL_addvalue(&b);
            continue;  /* skip the `addsize' at the end */
          }
          else {
            sprintf(buff, form, s);
            break;
          }
        }
        default: {  /* also treat cases `pnLlh' */
          return luaL_error(L, "invalid option " LUA_QL("%%%c") " to "
                               LUA_QL("format"), *(strfrmt - 1));
        }
      }
      luaL_addlstring(&b, buff, strlen(buff));
    }
  }
  luaL_pushresult(&b);
  return 1;
}